

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O1

ByteCode * __thiscall
ag::Generator::FunctionManager::Get(ByteCode *__return_storage_ptr__,FunctionManager *this,size_t i)

{
  unsigned_long uVar1;
  pointer pvVar2;
  pointer pBVar3;
  value_type *__val;
  undefined4 *puVar4;
  pointer ppVar5;
  size_t i_1;
  long lVar6;
  pointer puVar7;
  ulong uVar8;
  
  pBVar3 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start + i;
  uVar1 = (this->m_lengthAddr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[i];
  puVar7 = *(pointer *)
            ((long)&(pBVar3->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8) +
           (-4 - (*(long *)&(pBVar3->m_bytes).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + uVar1));
  puVar4 = (undefined4 *)operator_new(4);
  *puVar4 = 0;
  *(char *)puVar4 = (char)puVar7;
  *(char *)((long)puVar4 + 1) = (char)((ulong)puVar7 >> 8);
  *(char *)((long)puVar4 + 2) = (char)((ulong)puVar7 >> 0x10);
  *(char *)((long)puVar4 + 3) = (char)((ulong)puVar7 >> 0x18);
  lVar6 = 0;
  do {
    *(undefined1 *)
     (lVar6 + *(long *)&(pBVar3->m_bytes).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
              uVar1) = *(undefined1 *)((long)puVar4 + lVar6);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  operator_delete(puVar4,4);
  pvVar2 = (this->m_linkAddr).
           super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = pvVar2[i].
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[i].
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data + 8) != ppVar5) {
    uVar8 = 0;
    do {
      pBVar3 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = ppVar5[uVar8].first;
      lVar6 = (ppVar5[uVar8].second -
              (this->m_lengthAddr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[i]) + -4;
      puVar4 = (undefined4 *)operator_new(4);
      *puVar4 = 0;
      *(char *)puVar4 = (char)lVar6;
      *(char *)((long)puVar4 + 1) = (char)((ulong)lVar6 >> 8);
      *(char *)((long)puVar4 + 2) = (char)((ulong)lVar6 >> 0x10);
      *(char *)((long)puVar4 + 3) = (char)((ulong)lVar6 >> 0x18);
      lVar6 = 0;
      do {
        *(undefined1 *)
         (lVar6 + *(long *)&pBVar3[i].m_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + uVar1) = *(undefined1 *)((long)puVar4 + lVar6);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      operator_delete(puVar4,4);
      uVar8 = uVar8 + 1;
      pvVar2 = (this->m_linkAddr).
               super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = pvVar2[i].
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar2[i].
                                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - (long)ppVar5 >>
                            4));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&__return_storage_ptr__->m_bytes,
             &(this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl
              .super__Vector_impl_data._M_start[i].m_bytes);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get(size_t i)
			{
				m_code[i].Write(m_lengthAddr[i],
					BitConverter::GetUInt32(
						m_code[i].Count() - (m_lengthAddr[i] + sizeof(uint32_t))
					)
				);

				for (size_t j = 0; j < m_linkAddr[i].size(); j++)
					m_code[i].Write(m_linkAddr[i][j].first,
						BitConverter::GetUInt32(
							m_linkAddr[i][j].second - (m_lengthAddr[i] + sizeof(uint32_t))
						)
					);

				return m_code[i];
			}